

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tl.cpp
# Opt level: O3

bool __thiscall
pg::TLSolver::attractTangle(TLSolver *this,int t,int pl,bitset *R,bitset *Z,int maxpr)

{
  uint uVar1;
  pointer piVar2;
  pointer puVar3;
  uint *puVar4;
  ostream *poVar5;
  ulong uVar6;
  int *piVar7;
  ulong uVar8;
  int iVar9;
  uint *puVar11;
  uint uVar12;
  _label_vertex local_40;
  ulong uVar10;
  
  piVar2 = (this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  uVar12 = piVar2[t];
  if ((uVar12 & 1) != pl || (maxpr < (int)uVar12 || uVar12 == 0xffffffff)) {
    return false;
  }
  puVar3 = (this->tescs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar12 = puVar3[t];
  if (uVar12 == 0) {
    piVar7 = (this->tout).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
             super__Vector_impl_data._M_start[t];
    iVar9 = *piVar7;
    if (iVar9 == -1) {
      puVar3[t] = 0xffffffff;
      goto LAB_00172037;
    }
    uVar12 = 0;
    do {
      piVar7 = piVar7 + 1;
      uVar10 = (ulong)iVar9;
      iVar9 = *piVar7;
      uVar12 = uVar12 + (((this->G)._bits[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0);
    } while (iVar9 != -1);
  }
  puVar3[t] = uVar12 - 1;
  if (1 < (int)uVar12) {
    return false;
  }
LAB_00172037:
  puVar4 = (uint *)(this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                   super__Vector_impl_data._M_start[t];
  puVar11 = puVar4;
  do {
    uVar10 = (ulong)(int)*puVar11;
    if (uVar10 == 0xffffffffffffffff) {
      if (maxpr == 0x7fffffff) {
        piVar2[t] = -1;
      }
      uVar12 = *puVar4;
      while (uVar12 != 0xffffffff) {
        uVar6 = (ulong)(long)(int)uVar12 >> 6;
        uVar10 = Z->_bits[uVar6];
        if (((uVar10 >> ((ulong)uVar12 & 0x3f) & 1) == 0) &&
           (uVar8 = 1L << ((ulong)uVar12 & 0x3f), (R->_bits[uVar6] & uVar8) != 0)) {
          uVar1 = puVar4[1];
          Z->_bits[uVar6] = uVar10 | uVar8;
          this->str[(int)uVar12] = uVar1;
          iVar9 = (this->Q).pointer;
          (this->Q).pointer = iVar9 + 1;
          (this->Q).queue[iVar9] = uVar12;
          if (2 < (this->super_Solver).trace) {
            poVar5 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"\x1b[1;37mattracted \x1b[36m",0x16);
            local_40.g = (this->super_Solver).game;
            local_40.v = uVar12;
            poVar5 = operator<<(poVar5,&local_40);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[m by \x1b[1;36m",0xe);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,pl);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\x1b[m",3);
            poVar5 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," (via tangle ",0xd);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,t);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
            std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
          }
        }
        uVar12 = puVar4[2];
        puVar4 = puVar4 + 2;
      }
      return true;
    }
    puVar11 = puVar11 + 2;
  } while (((this->G)._bits[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0);
  piVar2[t] = -1;
  return false;
}

Assistant:

bool
TLSolver::attractTangle(const int t, const int pl, bitset &R, bitset &Z, int maxpr)
{
    /**
     * Check if tangle is won by player <pl> and not deleted.
     */
    {
        const int tangle_pr = tpr[t];
        if (tangle_pr == -1) return false; // deleted tangle
        if (tangle_pr > maxpr) return false; // too high...
        if (pl != (tangle_pr&1)) return false; // not of desired parity
    }

    /**
     * Check if the tangle can escape to R\Z.
     */
    {
        int e = tescs[t];
        if (e == 0) {
            int v, *ptr = tout[t];
            while ((v=*ptr++) != -1) {
                if (G[v]) e++;
            }
        }
        tescs[t] = --e;
        if (e > 0) return false;
    }

    /**
     * On-the-fly detect out-of-game tangles
     */
    {
        int *ptr = tv[t];
        for (;;) {
            const int v = *ptr++;
            if (v == -1) break;
            ptr++; // skip strategy
            if (!G[v]) {
                // on-the-fly detect out-of-game tangles
                tpr[t] = -1; // delete the tangle
                return false; // is now a deleted tangle
            }
        }
    }

    if (maxpr == INT_MAX) {
        // attracted to a dominion, so delete the tangle
        tpr[t] = -1;
    }

    /**
     * Attract!
     */
    {
        int *ptr = tv[t];
        for (;;) {
            const int v = *ptr++;
            if (v == -1) break;
            const int s = *ptr++;
            if (Z[v]) continue; // already in <Z>
            if (!R[v]) continue; // not in <R> (might be higher region)
            Z[v] = true;
            str[v] = s;
            Q.push(v);

#ifndef NDEBUG
            // maybe report event
            if (trace >= 3) {
                logger << "\033[1;37mattracted \033[36m" << label_vertex(v) << "\033[m by \033[1;36m" << pl << "\033[m";
                logger << " (via tangle " << t << ")" << std::endl;
            }
#endif
        }
    }

    return true;
}